

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitSelect(wasm::Select__(void *this,Select *curr)

{
  IString nextResult;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString nextResult_04;
  IString possible;
  IString possible_00;
  IString possible_01;
  bool bVar1;
  bool bVar2;
  Ref RVar3;
  Ref RVar4;
  Ref RVar5;
  Ref RVar6;
  Ref RVar7;
  Ref ifFalse_00;
  IString op;
  IString op_00;
  IString op_01;
  Ref condition;
  Ref ifFalse;
  Ref ifTrue;
  Type local_508;
  undefined1 local_500 [8];
  ScopedTemp tempCondition;
  undefined1 local_4c0 [8];
  ScopedTemp tempIfFalse;
  undefined1 local_480 [8];
  ScopedTemp tempIfTrue;
  EffectAnalyzer ifFalseEffects;
  undefined1 local_2e8 [8];
  EffectAnalyzer ifTrueEffects;
  EffectAnalyzer conditionEffects;
  bool useLocals;
  Select *curr_local;
  ExpressionProcessor *this_local;
  
  bVar1 = false;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PassOptions *)(*this + 0x60),*(Module **)((long)this + 0x20),
             *(Expression **)(curr + 0x20));
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_2e8,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),*(Expression **)(curr + 0x10));
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)&tempIfTrue.needFree,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),*(Expression **)(curr + 0x18));
  bVar2 = EffectAnalyzer::invalidates
                    ((EffectAnalyzer *)
                     &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,(EffectAnalyzer *)local_2e8);
  if ((((bVar2) ||
       (bVar2 = EffectAnalyzer::invalidates
                          ((EffectAnalyzer *)
                           &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(EffectAnalyzer *)&tempIfTrue.needFree), bVar2)) ||
      (bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_2e8), bVar2)) ||
     (bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&tempIfTrue.needFree), bVar2)) {
    bVar1 = true;
  }
  if (bVar1) {
    tempIfFalse._32_8_ = NO_RESULT;
    possible_01.str._M_str = cashew::RETURN;
    possible_01.str._M_len = (size_t)NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_480,(Type)*(uintptr_t *)(curr + 8),*this,*(Function **)((long)this + 0x18),
               possible_01);
    tempCondition._32_8_ = NO_RESULT;
    possible_00.str._M_str = cashew::RETURN;
    possible_00.str._M_len = (size_t)NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_4c0,(Type)*(uintptr_t *)(curr + 8),*this,*(Function **)((long)this + 0x18),
               possible_00);
    Type::Type(&local_508,i32);
    possible.str._M_str = cashew::RETURN;
    possible.str._M_len = (size_t)NO_RESULT;
    RVar7.inst = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_500,local_508,*this,*(Function **)((long)this + 0x18),possible);
    nextResult_04.str._M_str = _realloc;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    RVar3 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x10),nextResult_04)
    ;
    nextResult_03.str._M_str = _realloc;
    nextResult_03.str._M_len = EXPRESSION_RESULT;
    RVar4 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x18),nextResult_03)
    ;
    nextResult_02.str._M_str = _realloc;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    RVar5 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x20),nextResult_02)
    ;
    RVar6 = processExpression::ExpressionProcessor::ScopedTemp::getAstName((ScopedTemp *)local_480);
    op.str._M_str = (char *)RVar3.inst;
    op.str._M_len = BLOCK;
    RVar3 = cashew::ValueBuilder::makeBinary(RVar6.inst,cashew::SET,op,RVar7);
    RVar6 = processExpression::ExpressionProcessor::ScopedTemp::getAstName((ScopedTemp *)local_4c0);
    op_00.str._M_str = (char *)RVar4.inst;
    op_00.str._M_len = BLOCK;
    RVar4 = cashew::ValueBuilder::makeBinary(RVar6.inst,cashew::SET,op_00,RVar7);
    RVar6 = processExpression::ExpressionProcessor::ScopedTemp::getAstName((ScopedTemp *)local_500);
    op_01.str._M_str = (char *)RVar5.inst;
    op_01.str._M_len = BLOCK;
    RVar7 = cashew::ValueBuilder::makeBinary(RVar6.inst,cashew::SET,op_01,RVar7);
    RVar5 = processExpression::ExpressionProcessor::ScopedTemp::getAstName((ScopedTemp *)local_500);
    RVar6 = processExpression::ExpressionProcessor::ScopedTemp::getAstName((ScopedTemp *)local_480);
    ifFalse_00 = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                           ((ScopedTemp *)local_4c0);
    RVar5 = cashew::ValueBuilder::makeConditional(RVar5,RVar6,ifFalse_00);
    RVar7 = cashew::ValueBuilder::makeSeq(RVar7,RVar5);
    RVar7 = cashew::ValueBuilder::makeSeq(RVar4,RVar7);
    this_local = (ExpressionProcessor *)cashew::ValueBuilder::makeSeq(RVar3,RVar7);
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_500);
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_4c0);
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_480);
  }
  else {
    nextResult_01.str._M_str = _realloc;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar7 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x20),nextResult_01)
    ;
    nextResult_00.str._M_str = _realloc;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    RVar3 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x10),nextResult_00)
    ;
    nextResult.str._M_str = _realloc;
    nextResult.str._M_len = EXPRESSION_RESULT;
    RVar4 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x18),nextResult);
    this_local = (ExpressionProcessor *)cashew::ValueBuilder::makeConditional(RVar7,RVar3,RVar4);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&tempIfTrue.needFree);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2e8);
  EffectAnalyzer::~EffectAnalyzer
            ((EffectAnalyzer *)
             &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (Ref)(Value *)this_local;
}

Assistant:

Ref visitSelect(Select* curr) {
      // If the condition has effects that interact with the operands, we must
      // reorder it to the start. We must also use locals if the values have
      // side effects, as a JS conditional does not visit both sides.
      bool useLocals = false;
      EffectAnalyzer conditionEffects(
        parent->options, *module, curr->condition);
      EffectAnalyzer ifTrueEffects(parent->options, *module, curr->ifTrue);
      EffectAnalyzer ifFalseEffects(parent->options, *module, curr->ifFalse);
      if (conditionEffects.invalidates(ifTrueEffects) ||
          conditionEffects.invalidates(ifFalseEffects) ||
          ifTrueEffects.hasSideEffects() || ifFalseEffects.hasSideEffects()) {
        useLocals = true;
      }
      if (useLocals) {
        ScopedTemp tempIfTrue(curr->type, parent, func),
          tempIfFalse(curr->type, parent, func),
          tempCondition(Type::i32, parent, func);
        Ref ifTrue = visit(curr->ifTrue, EXPRESSION_RESULT);
        Ref ifFalse = visit(curr->ifFalse, EXPRESSION_RESULT);
        Ref condition = visit(curr->condition, EXPRESSION_RESULT);
        return ValueBuilder::makeSeq(
          ValueBuilder::makeBinary(tempIfTrue.getAstName(), SET, ifTrue),
          ValueBuilder::makeSeq(
            ValueBuilder::makeBinary(tempIfFalse.getAstName(), SET, ifFalse),
            ValueBuilder::makeSeq(
              ValueBuilder::makeBinary(
                tempCondition.getAstName(), SET, condition),
              ValueBuilder::makeConditional(tempCondition.getAstName(),
                                            tempIfTrue.getAstName(),
                                            tempIfFalse.getAstName()))));
      } else {
        // Simple case without reordering.
        return ValueBuilder::makeConditional(
          visit(curr->condition, EXPRESSION_RESULT),
          visit(curr->ifTrue, EXPRESSION_RESULT),
          visit(curr->ifFalse, EXPRESSION_RESULT));
      }
    }